

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::OutputLayout::Run(OutputLayout *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  long lVar2;
  GLuint program;
  mapped_type *pmVar3;
  key_type local_118;
  long error;
  allocator<char> local_e9;
  GLenum props [7];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indices;
  GLint expected_b [7];
  GLint expected_a [7];
  GLint expected_e [7];
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x15])(&indices,this);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(&local_118,this);
  program = PIQBase::CreateProgram
                      ((PIQBase *)this,(char *)indices._M_t._M_impl._0_8_,local_118._M_dataplus._M_p
                       ,false);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&indices);
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  PIQBase::LinkProgram((PIQBase *)this,program);
  error = 0;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e4,0x92f5,3,&error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e4,0x92f6,5,&error);
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indices._M_t._M_impl.super__Rb_tree_header._M_header;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"a",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,&indices,&local_118,&error);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"b",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,&indices,&local_118,&error);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"e",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,&indices,&local_118,&error);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"a",(allocator<char> *)expected_a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_118);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"a[0]",(allocator<char> *)expected_b);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar1,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"b",(allocator<char> *)expected_a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_118);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"b",(allocator<char> *)expected_b);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar1,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"e",(allocator<char> *)expected_a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_118);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"e",(allocator<char> *)expected_b);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar1,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"a[0]",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,&local_118,0,&error);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"a",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,&local_118,0,&error);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"a[1]",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,&local_118,1,&error);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"b",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,&local_118,2,&error);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"e",(allocator<char> *)props);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,&local_118,3,&error);
  std::__cxx11::string::~string((string *)&local_118);
  props[4] = 0x930a;
  props[5] = 0x9306;
  props[6] = 0x930e;
  props[0] = 0x92f9;
  props[1] = 0x92fa;
  props[2] = 0x92fb;
  props[3] = 0x930b;
  expected_a[4] = 1;
  expected_a[5] = 0;
  expected_a[6] = 0;
  expected_a[0] = 5;
  expected_a[1] = 0x8b51;
  expected_a[2] = 2;
  expected_a[3] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"a",(allocator<char> *)expected_b);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_118);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e4,(ulong)*pmVar3,7,props,7,(allocator<char> *)expected_a,&error
           );
  std::__cxx11::string::~string((string *)&local_118);
  expected_b[4] = 1;
  expected_b[5] = 0;
  expected_b[6] = 2;
  expected_b[0] = 2;
  expected_b[1] = 0x1405;
  expected_b[2] = 1;
  expected_b[3] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"b",(allocator<char> *)expected_e);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_118);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e4,(ulong)*pmVar3,7,props,7,(allocator<char> *)expected_b,&error
           );
  std::__cxx11::string::~string((string *)&local_118);
  expected_e[4] = 1;
  expected_e[5] = 0;
  expected_e[6] = 3;
  expected_e[0] = 2;
  expected_e[1] = 0x8b50;
  expected_e[2] = 1;
  expected_e[3] = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"e",&local_e9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_118);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e4,(ulong)*pmVar3,7,props,7,(allocator<char> *)expected_e,&error
           );
  std::__cxx11::string::~string((string *)&local_118);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  lVar2 = error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indices._M_t);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_OUTPUT, GL_ACTIVE_RESOURCES, 3, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_OUTPUT, GL_MAX_NAME_LENGTH, 5, error);

		std::map<std::string, GLuint> indices;
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_OUTPUT, indices, "a", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_OUTPUT, indices, "b", error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_OUTPUT, indices, "e", error);

		VerifyGetProgramResourceName(program, GL_PROGRAM_OUTPUT, indices["a"], "a[0]", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_OUTPUT, indices["b"], "b", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_OUTPUT, indices["e"], "e", error);

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "a[0]", 0, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "a", 0, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "a[1]", 1, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "b", 2, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "e", 3, error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		GLint expected_a[] = { 5, 35665, 2, 0, 1, 0, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, indices["a"], 7, props, 7, expected_a, error);
		GLint expected_b[] = { 2, 5125, 1, 0, 1, 0, 2 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, indices["b"], 7, props, 7, expected_b, error);
		GLint expected_e[] = { 2, 35664, 1, 0, 1, 0, 3 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, indices["e"], 7, props, 7, expected_e, error);

		glDeleteProgram(program);
		return error;
	}